

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitIf(OptimizeInstructions *this,If *curr)

{
  bool bVar1;
  Expression *pEVar2;
  Module *wasm;
  Drop *pDVar3;
  Block *pBVar4;
  ExpressionList *this_00;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  bool local_1f1;
  bool local_1e1;
  optional<wasm::Type> local_1d8;
  Block *local_1c8;
  Block *ret;
  optional<wasm::Type> local_1b8;
  Builder local_1a8;
  Builder builder;
  bool wouldBecomeUnreachable;
  EffectAnalyzer local_188;
  byte local_25;
  BasicType local_24;
  bool needCondition;
  Unary *pUStack_20;
  Unary *unary;
  If *curr_local;
  OptimizeInstructions *this_local;
  
  unary = (Unary *)curr;
  curr_local = (If *)this;
  pEVar2 = optimizeBoolean(this,curr->condition);
  *(Expression **)&unary->op = pEVar2;
  if (*(long *)&unary[1].super_SpecificExpression<(wasm::Expression::Id)15>.super_Expression != 0) {
    pUStack_20 = Expression::dynCast<wasm::Unary>(*(Expression **)&unary->op);
    if ((pUStack_20 != (Unary *)0x0) && (pUStack_20->op == EqZInt32)) {
      *(Expression **)&unary->op = pUStack_20->value;
      std::swap<wasm::Expression*>(&unary->value,(Expression **)(unary + 1));
    }
    local_24 = unreachable;
    bVar1 = wasm::Type::operator!=((Type *)(*(long *)&unary->op + 8),&local_24);
    local_1e1 = false;
    if (bVar1) {
      local_1e1 = ExpressionAnalyzer::equal
                            (unary->value,
                             *(Expression **)
                              &unary[1].super_SpecificExpression<(wasm::Expression::Id)15>.
                               super_Expression);
    }
    if (local_1e1 == false) {
      optimizeTernary<wasm::If>(this,(If *)unary);
    }
    else {
      effects(&local_188,this,*(Expression **)&unary->op);
      bVar1 = EffectAnalyzer::hasSideEffects(&local_188);
      EffectAnalyzer::~EffectAnalyzer(&local_188);
      local_25 = bVar1;
      bVar1 = wasm::Type::isConcrete
                        (&(unary->super_SpecificExpression<(wasm::Expression::Id)15>).
                          super_Expression.type);
      local_1f1 = false;
      if (bVar1) {
        builder.wasm._4_4_ = 1;
        local_1f1 = wasm::Type::operator==
                              (&unary->value->type,(BasicType *)((long)&builder.wasm + 4));
      }
      wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
      Builder::Builder(&local_1a8,wasm);
      if ((local_1f1 == false) && ((local_25 & 1) == 0)) {
        replaceCurrent(this,unary->value);
      }
      else if (local_1f1 == false) {
        pDVar3 = Builder::makeDrop(&local_1a8,*(Expression **)&unary->op);
        pEVar2 = unary->value;
        std::optional<wasm::Type>::optional(&local_1b8);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_1b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_1b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar4 = Builder::makeSequence(&local_1a8,(Expression *)pDVar3,pEVar2,type);
        replaceCurrent(this,(Expression *)pBVar4);
      }
      else {
        local_1c8 = Builder::makeBlock(&local_1a8,(Expression *)0x0);
        if ((local_25 & 1) != 0) {
          this_00 = &local_1c8->list;
          pDVar3 = Builder::makeDrop(&local_1a8,*(Expression **)&unary->op);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pDVar3);
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(local_1c8->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   unary->value);
        pBVar4 = local_1c8;
        std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                  (&local_1d8,
                   &(unary->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                    type);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_1d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_1d8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        Block::finalize(pBVar4,type_,Unknown);
        replaceCurrent(this,(Expression *)local_1c8);
      }
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    curr->condition = optimizeBoolean(curr->condition);
    if (curr->ifFalse) {
      if (auto* unary = curr->condition->dynCast<Unary>()) {
        if (unary->op == EqZInt32) {
          // flip if-else arms to get rid of an eqz
          curr->condition = unary->value;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
      if (curr->condition->type != Type::unreachable &&
          ExpressionAnalyzer::equal(curr->ifTrue, curr->ifFalse)) {
        // The sides are identical, so fold. If we can replace the If with one
        // arm and there are no side effects in the condition, replace it. But
        // make sure not to change a concrete expression to an unreachable
        // expression because we want to avoid having to refinalize.
        bool needCondition = effects(curr->condition).hasSideEffects();
        bool wouldBecomeUnreachable =
          curr->type.isConcrete() && curr->ifTrue->type == Type::unreachable;
        Builder builder(*getModule());
        if (!wouldBecomeUnreachable && !needCondition) {
          return replaceCurrent(curr->ifTrue);
        } else if (!wouldBecomeUnreachable) {
          return replaceCurrent(builder.makeSequence(
            builder.makeDrop(curr->condition), curr->ifTrue));
        } else {
          // Emit a block with the original concrete type.
          auto* ret = builder.makeBlock();
          if (needCondition) {
            ret->list.push_back(builder.makeDrop(curr->condition));
          }
          ret->list.push_back(curr->ifTrue);
          ret->finalize(curr->type);
          return replaceCurrent(ret);
        }
      }
      optimizeTernary(curr);
    }
  }